

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

int google::protobuf::internal::TcParser::FieldNumber(TcParseTableBase *table,FieldEntry *entry)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ushort *puVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  
  lVar5 = ((long)((long)entry - ((long)&table->has_bits_offset + (ulong)table->field_entries_offset)
                 ) >> 2) * -0x5555555555555555;
  if (table->skipmap32 != 0xffffffff) {
    uVar3 = ~table->skipmap32;
    do {
      bVar8 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      if (bVar8) {
        iVar4 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
          }
        }
        return iVar4 + 1;
      }
      uVar3 = uVar3 - 1 & uVar3;
    } while (uVar3 != 0);
  }
  puVar6 = (ushort *)((long)&table->has_bits_offset + (ulong)table->lookup_table_offset);
  iVar4 = 0;
  do {
    while( true ) {
      iVar2 = *(int *)puVar6;
      if ((puVar6[1] & *puVar6) == 0xffff) {
        FieldNumber();
      }
      uVar1 = puVar6[2];
      puVar6 = puVar6 + 3;
      uVar3 = 0;
      if (uVar1 != 0) break;
      bVar8 = false;
LAB_002b8412:
      if (bVar8) {
        return iVar4;
      }
    }
    bVar8 = true;
    while (*puVar6 == 0xffff) {
LAB_002b83da:
      puVar6 = puVar6 + 2;
      uVar3 = uVar3 + 1;
      bVar8 = uVar3 < uVar1;
      if (uVar3 == uVar1) goto LAB_002b8412;
    }
    uVar7 = (uint)(ushort)~*puVar6;
    while (bVar9 = lVar5 != 0, lVar5 = lVar5 + -1, bVar9) {
      uVar7 = uVar7 - 1 & uVar7;
      if (uVar7 == 0) goto LAB_002b83da;
    }
    iVar4 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
      }
    }
    iVar4 = iVar4 + uVar3 * 0x10 + iVar2;
    lVar5 = 0;
    if (bVar8) {
      return iVar4;
    }
  } while( true );
}

Assistant:

int TcParser::FieldNumber(const TcParseTableBase* table,
                          const TcParseTableBase::FieldEntry* entry) {
  // The data structure was not designed to be queried in this direction, so
  // we have to do a linear search over the entries to see which one matches
  // while keeping track of the field number.
  // But it is fine because we are only using this for debug check messages.
  size_t need_to_skip = entry - table->field_entries_begin();
  const auto visit_bitmap = [&](uint32_t field_bitmap,
                                int base_field_number) -> absl::optional<int> {
    for (; field_bitmap != 0; field_bitmap &= field_bitmap - 1) {
      if (need_to_skip == 0) {
        return absl::countr_zero(field_bitmap) + base_field_number;
      }
      --need_to_skip;
    }
    return absl::nullopt;
  };
  if (auto number = visit_bitmap(~table->skipmap32, 1)) {
    return *number;
  }

  for (const uint16_t* lookup_table = table->field_lookup_begin();
       lookup_table[0] != 0xFFFF || lookup_table[1] != 0xFFFF;) {
    uint32_t fstart = lookup_table[0] | (lookup_table[1] << 16);
    lookup_table += 2;
    const uint16_t num_skip_entries = *lookup_table++;
    for (uint16_t i = 0; i < num_skip_entries; ++i) {
      // for each group of 16 fields we have: a
      // bitmap of 16 bits a 16-bit field-entry
      // offset for the first of them.
      if (auto number = visit_bitmap(static_cast<uint16_t>(~*lookup_table),
                                     fstart + 16 * i)) {
        return *number;
      }
      lookup_table += 2;
    }
  }
  Unreachable();
}